

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

int __thiscall
lodepng::ExtractZlib::HuffmanTree::makeFromLengths
          (HuffmanTree *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *bitlen,
          unsigned_long maxbitlen)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  unsigned_long uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  unsigned_long uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong __n;
  ulong uVar13;
  bool bVar14;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nextcode;
  vector<unsigned_long,_std::allocator<unsigned_long>_> blcount;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tree1d;
  allocator_type local_91;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_88;
  value_type_conflict2 local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  puVar2 = (bitlen->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (bitlen->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)puVar3 - (long)puVar2 >> 3;
  local_90 = bitlen;
  local_88 = &this->tree2d;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,__n,(allocator_type *)&local_60);
  uVar12 = maxbitlen + 1;
  local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_60,uVar12,(value_type_conflict2 *)&local_78,(allocator_type *)&local_80);
  local_80 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_78,uVar12,&local_80,&local_91);
  if (puVar3 != puVar2) {
    puVar4 = (local_90->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[puVar4[lVar8]] =
           local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[puVar4[lVar8]] + 1;
      lVar8 = lVar8 + 1;
    } while (__n + (__n == 0) != lVar8);
  }
  if (maxbitlen != 0) {
    uVar10 = 2;
    if (2 < uVar12) {
      uVar10 = uVar12;
    }
    uVar9 = *local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      uVar9 = (uVar9 + local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[lVar8]) * 2;
      local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[lVar8 + 1] = uVar9;
      lVar8 = lVar8 + 1;
    } while (uVar10 - 1 != lVar8);
  }
  if (puVar3 != puVar2) {
    puVar4 = (local_90->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = 0;
    do {
      uVar9 = puVar4[lVar8];
      if (uVar9 != 0) {
        uVar5 = local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9];
        local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] = uVar5 + 1;
        local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8] = uVar5;
      }
      lVar8 = lVar8 + 1;
    } while (__n + (__n == 0) != lVar8);
  }
  puVar4 = (local_88->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((local_88->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    (local_88->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar4;
  }
  local_80 = 0x7fff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (local_88,(long)puVar3 - (long)puVar2 >> 2,&local_80);
  if (puVar3 != puVar2) {
    puVar2 = (local_90->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bVar14 = true;
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    do {
      uVar13 = puVar2[uVar10];
      if (uVar13 != 0) {
        puVar3 = (local_88->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = 0;
        do {
          if (__n - 2 < uVar12) {
            iVar6 = 0x37;
            if (!bVar14) {
              iVar6 = 0;
            }
            goto LAB_00120e99;
          }
          lVar8 = uVar12 * 2 +
                  (ulong)((local_48.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar10] >>
                           ((ulong)(~(uint)uVar7 + (int)uVar13) & 0x3f) & 1) != 0);
          if (puVar3[lVar8] == 0x7fff) {
            if (uVar7 + 1 == uVar13) {
              puVar3[lVar8] = uVar10;
              uVar12 = 0;
            }
            else {
              lVar1 = uVar11 + __n;
              uVar11 = uVar11 + 1;
              puVar3[lVar8] = lVar1 + 1;
              uVar12 = uVar11;
            }
          }
          else {
            uVar12 = puVar3[lVar8] - __n;
          }
          uVar7 = uVar7 + 1;
          uVar13 = puVar2[uVar10];
        } while (uVar7 < uVar13);
      }
      uVar10 = uVar10 + 1;
      bVar14 = uVar10 < __n;
    } while (uVar10 != __n + (__n == 0));
  }
  iVar6 = 0;
LAB_00120e99:
  if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return iVar6;
}

Assistant:

int makeFromLengths(const std::vector<unsigned long>& bitlen, unsigned long maxbitlen) { //make tree given the lengths
      unsigned long numcodes = (unsigned long)(bitlen.size()), treepos = 0, nodefilled = 0;
      std::vector<unsigned long> tree1d(numcodes), blcount(maxbitlen + 1, 0), nextcode(maxbitlen + 1, 0);
      //count number of instances of each code length
      for(unsigned long bits = 0; bits < numcodes; bits++) blcount[bitlen[bits]]++;
      for(unsigned long bits = 1; bits <= maxbitlen; bits++) {
        nextcode[bits] = (nextcode[bits - 1] + blcount[bits - 1]) << 1;
      }
      //generate all the codes
      for(unsigned long n = 0; n < numcodes; n++) if(bitlen[n] != 0) tree1d[n] = nextcode[bitlen[n]]++;
      tree2d.clear(); tree2d.resize(numcodes * 2, 32767); //32767 here means the tree2d isn't filled there yet
      for(unsigned long n = 0; n < numcodes; n++) //the codes
      for(unsigned long i = 0; i < bitlen[n]; i++) { //the bits for this code
        unsigned long bit = (tree1d[n] >> (bitlen[n] - i - 1)) & 1;
        if(treepos > numcodes - 2) return 55;
        if(tree2d[2 * treepos + bit] == 32767) { //not yet filled in
          if(i + 1 == bitlen[n]) {
            //last bit
            tree2d[2 * treepos + bit] = n;
            treepos = 0;
          } else {
            //addresses are encoded as values > numcodes
            tree2d[2 * treepos + bit] = ++nodefilled + numcodes;
            treepos = nodefilled;
          }
        }
        else treepos = tree2d[2 * treepos + bit] - numcodes; //subtract numcodes from address to get address value
      }
      return 0;
    }